

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O1

shared_ptr<duckdb::CSVBuffer,_true> __thiscall
duckdb::CSVBuffer::Next
          (CSVBuffer *this,CSVFileHandle *file_handle,idx_t buffer_size,bool *has_seaked)

{
  CSVBuffer *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char *in_R8;
  shared_ptr<duckdb::CSVBuffer,_true> sVar3;
  undefined1 local_59;
  shared_ptr<duckdb::CSVBuffer,_true> next_csv_buffer;
  idx_t buffer_size_local;
  CSVBuffer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 *local_30;
  unsigned_long local_28;
  
  buffer_size_local = (idx_t)has_seaked;
  if (*in_R8 == '\x01') {
    CSVFileHandle::Seek((CSVFileHandle *)buffer_size,
                        (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.
                               __next)->__prev +
                        *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex +
                                 0x10));
    *in_R8 = '\0';
  }
  local_28 = (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.__next)->
                    __prev +
             *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 0x10);
  local_30 = (undefined1 *)
             ((long)&((file_handle->file_handle).
                      super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                      .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl)->
                     _vptr_FileHandle + 1);
  local_40 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBuffer,std::allocator<duckdb::CSVBuffer>,duckdb::CSVFileHandle&,duckdb::ClientContext&,unsigned_long&,unsigned_long,unsigned_long>
            (&local_38,&local_40,(allocator<duckdb::CSVBuffer> *)&local_59,
             (CSVFileHandle *)buffer_size,
             *(ClientContext **)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 8),
             &buffer_size_local,&local_28,(unsigned_long *)&local_30);
  next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_40;
  next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  pCVar1 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(&next_csv_buffer);
  _Var2 = next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  if (pCVar1->actual_buffer_size == 0) {
    *(undefined8 *)this = 0;
    this->context = (ClientContext *)0x0;
  }
  else {
    this->context = (ClientContext *)0x0;
    next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    this->context = (ClientContext *)_Var2._M_pi;
    next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
  }
  _Var2._M_pi = extraout_RDX;
  if (next_csv_buffer.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (next_csv_buffer.internal.
               super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::CSVBuffer,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVBuffer> CSVBuffer::Next(CSVFileHandle &file_handle, idx_t buffer_size, bool &has_seaked) const {
	if (has_seaked) {
		// This means that at some point a reload was done, and we are currently on the incorrect position in our file
		// handle
		file_handle.Seek(global_csv_start + actual_buffer_size);
		has_seaked = false;
	}
	auto next_csv_buffer = make_shared_ptr<CSVBuffer>(file_handle, context, buffer_size,
	                                                  global_csv_start + actual_buffer_size, buffer_idx + 1);
	if (next_csv_buffer->GetBufferSize() == 0) {
		// We are done reading
		return nullptr;
	}
	return next_csv_buffer;
}